

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::CreateInstance
          (ArenaStringPtr *this,Arena *arena,string *initial_value)

{
  pointer pcVar1;
  LogMessage *other;
  string *psVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (initial_value == (string *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/arenastring.h"
               ,0x172);
    other = LogMessage::operator<<(&local_58,"CHECK failed: initial_value != NULL: ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  if (arena == (Arena *)0x0) {
    psVar2 = (string *)operator_new(0x20);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    pcVar1 = (initial_value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,pcVar1,pcVar1 + initial_value->_M_string_length);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    }
    psVar2 = (string *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       (&arena->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    pcVar1 = (initial_value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,pcVar1,pcVar1 + initial_value->_M_string_length);
  }
  this->ptr_ = psVar2;
  return;
}

Assistant:

PROTOBUF_NOINLINE
  void CreateInstance(Arena* arena, const ::std::string* initial_value) {
    GOOGLE_DCHECK(initial_value != NULL);
    // uses "new ::std::string" when arena is nullptr
    ptr_ = Arena::Create< ::std::string>(arena, *initial_value);
  }